

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall cursespp::App::InitCurses(App *this)

{
  initscr();
  nonl();
  cbreak();
  noecho();
  keypad(_stdscr,1);
  refresh();
  curs_set(0);
  mousemask(0xfffffff,0);
  mouseinterval(0);
  wtimeout(_stdscr,0x4b);
  set_escdelay(0x14);
  Colors::Init(this->colorMode,this->bgType);
  if ((this->colorTheme)._M_string_length != 0) {
    Colors::SetTheme(&this->colorTheme);
  }
  this->initialized = true;
  return;
}

Assistant:

void App::InitCurses() {
    initscr();
    nonl();
    cbreak();
    noecho();
    keypad(stdscr, TRUE);
    refresh();
    curs_set(0);
    mousemask(ALL_MOUSE_EVENTS, nullptr);
    mouseinterval(0);
    timeout(IDLE_TIMEOUT_MS);

#ifndef WIN32
    set_escdelay(20);
#endif

#ifdef WIN32
    PDC_set_function_key(FUNCTION_KEY_SHUT_DOWN, 4);
    #if defined PDCURSES_WINGUI && !defined PDCURSES_WINCON
        /* needs to happen after initscr() */
        PDC_set_default_menu_visibility(0);
        PDC_set_window_resized_callback(&pdcWinguiResizeCallback);
        PDC_set_title(this->appTitle.c_str());
        win32::ConfigureThemeAwareness();
        win32::InterceptWndProc();
        win32::SetAppTitle(this->appTitle);
        if (this->iconId) {
            this->SetIcon(this->iconId);
        }
    #endif
#endif

    Colors::Init(this->colorMode, this->bgType);

    if (this->colorTheme.size()) {
        Colors::SetTheme(this->colorTheme);
    }

    this->initialized = true;
}